

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslScanContext.cpp
# Opt level: O1

EHlslTokenClass __thiscall
glslang::HlslScanContext::tokenizeClass(HlslScanContext *this,HlslToken *token)

{
  HlslToken *pHVar1;
  bool bVar2;
  int iVar3;
  TPoolAllocator *this_00;
  TString *this_01;
  pool_allocator<char> *ppVar4;
  char *pcVar5;
  TParseContextBase *pTVar6;
  _func_int **pp_Var7;
  EHlslTokenClass unaff_R13D;
  char buf [2];
  TPpToken ppToken;
  pool_allocator<char> local_478;
  char *local_470;
  TPpToken local_468;
  
  do {
    this->parserToken = token;
    local_468.space = false;
    local_468.fullyExpanded = false;
    local_468.field_3 = (anon_union_8_3_7104ca99_for_TPpToken_3)0x0;
    local_468.loc.name = (TString *)0x0;
    local_468.loc.string = 0;
    local_468.loc.line = 0;
    local_468.loc.column = 0;
    local_468.name[0] = '\0';
    iVar3 = TPpContext::tokenize(this->ppContext,&local_468);
    if (iVar3 == -1) {
      bVar2 = false;
      unaff_R13D = EHTokNone;
      goto LAB_0044e155;
    }
    this->tokenText = local_468.name;
    *(ulong *)&(this->loc).column = CONCAT44(local_468.loc._20_4_,local_468.loc.column);
    (this->loc).name = local_468.loc.name;
    (this->loc).string = local_468.loc.string;
    (this->loc).line = local_468.loc.line;
    pHVar1 = this->parserToken;
    *(ulong *)&(pHVar1->loc).column = CONCAT44(local_468.loc._20_4_,local_468.loc.column);
    *(undefined4 *)&(pHVar1->loc).name = local_468.loc.name._0_4_;
    *(undefined4 *)((long)&(pHVar1->loc).name + 4) = local_468.loc.name._4_4_;
    (pHVar1->loc).string = local_468.loc.string;
    (pHVar1->loc).line = local_468.loc.line;
    switch(iVar3) {
    case 0x21:
      unaff_R13D = EHTokBang;
      break;
    default:
      if (iVar3 < 0x7f) {
        local_478.allocator._0_2_ = (ushort)(byte)iVar3;
        pTVar6 = this->parseContext;
        pp_Var7 = (pTVar6->super_TParseVersions)._vptr_TParseVersions;
        ppVar4 = &local_478;
      }
      else {
        ppVar4 = (pool_allocator<char> *)this->tokenText;
        if (*(char *)ppVar4 == '\0') {
          pTVar6 = this->parseContext;
          pp_Var7 = (pTVar6->super_TParseVersions)._vptr_TParseVersions;
          pcVar5 = "unexpected token";
          ppVar4 = (pool_allocator<char> *)0x6e6688;
          goto LAB_0044e1a3;
        }
        pTVar6 = this->parseContext;
        pp_Var7 = (pTVar6->super_TParseVersions)._vptr_TParseVersions;
      }
      pcVar5 = "unexpected token";
      goto LAB_0044e1a3;
    case 0x25:
      unaff_R13D = EHTokPercent;
      break;
    case 0x26:
      unaff_R13D = EHTokAmpersand;
      break;
    case 0x28:
      unaff_R13D = EHTokLeftParen;
      break;
    case 0x29:
      unaff_R13D = EHTokRightParen;
      break;
    case 0x2a:
      unaff_R13D = EHTokStar;
      break;
    case 0x2b:
      unaff_R13D = EHTokPlus;
      break;
    case 0x2c:
      unaff_R13D = EHTokComma;
      break;
    case 0x2d:
      unaff_R13D = EHTokDash;
      break;
    case 0x2e:
      unaff_R13D = EHTokDot;
      break;
    case 0x2f:
      unaff_R13D = EHTokSlash;
      break;
    case 0x3a:
      unaff_R13D = EHTokColon;
      break;
    case 0x3b:
      unaff_R13D = EHTokSemicolon;
      break;
    case 0x3c:
      unaff_R13D = EHTokLeftAngle;
      break;
    case 0x3d:
      unaff_R13D = EHTokAssign;
      break;
    case 0x3e:
      unaff_R13D = EHTokRightAngle;
      break;
    case 0x3f:
      unaff_R13D = EHTokQuestion;
      break;
    case 0x5b:
      unaff_R13D = EHTokLeftBracket;
      break;
    case 0x5c:
      pTVar6 = this->parseContext;
      pp_Var7 = (pTVar6->super_TParseVersions)._vptr_TParseVersions;
      pcVar5 = "illegal use of escape character";
      ppVar4 = (pool_allocator<char> *)0x752eec;
LAB_0044e1a3:
      (*pp_Var7[0x2d])(pTVar6,&this->loc,pcVar5,ppVar4,"");
      bVar2 = true;
      goto LAB_0044e155;
    case 0x5d:
      unaff_R13D = EHTokRightBracket;
      break;
    case 0x5e:
      unaff_R13D = EHTokCaret;
      break;
    case 0x7b:
      unaff_R13D = EHTokLeftBrace;
      break;
    case 0x7c:
      unaff_R13D = EHTokVerticalBar;
      break;
    case 0x7d:
      unaff_R13D = EHTokRightBrace;
      break;
    case 0x7e:
      unaff_R13D = EHTokTilde;
      break;
    case 0x81:
      unaff_R13D = EHTokAddAssign;
      break;
    case 0x82:
      unaff_R13D = EHTokSubAssign;
      break;
    case 0x83:
      unaff_R13D = EHTokMulAssign;
      break;
    case 0x84:
      unaff_R13D = EHTokDivAssign;
      break;
    case 0x85:
      unaff_R13D = EHTokModAssign;
      break;
    case 0x86:
      unaff_R13D = EHTokRightOp;
      break;
    case 0x87:
      unaff_R13D = EHTokLeftOp;
      break;
    case 0x88:
      unaff_R13D = EHTokRightAssign;
      break;
    case 0x89:
      unaff_R13D = EHTokLeftAssign;
      break;
    case 0x8a:
      unaff_R13D = EHTokAndAssign;
      break;
    case 0x8b:
      unaff_R13D = EHTokOrAssign;
      break;
    case 0x8c:
      unaff_R13D = EHTokXorAssign;
      break;
    case 0x8d:
      unaff_R13D = EHTokAndOp;
      break;
    case 0x8e:
      unaff_R13D = EHTokOrOp;
      break;
    case 0x8f:
      unaff_R13D = EHTokXorOp;
      break;
    case 0x90:
      unaff_R13D = EHTokEqOp;
      break;
    case 0x91:
      unaff_R13D = EHTokNeOp;
      break;
    case 0x92:
      unaff_R13D = EHTokGeOp;
      break;
    case 0x93:
      unaff_R13D = EHTokLeOp;
      break;
    case 0x94:
      unaff_R13D = EHTokDecOp;
      break;
    case 0x95:
      unaff_R13D = EHTokIncOp;
      break;
    case 0x96:
      unaff_R13D = EHTokColonColon;
      break;
    case 0x98:
      (this->parserToken->field_2).i = local_468.field_3.ival;
      unaff_R13D = EHTokIntConstant;
      break;
    case 0x99:
      (this->parserToken->field_2).i = local_468.field_3.ival;
      unaff_R13D = EHTokUintConstant;
      break;
    case 0x9e:
      this->parserToken->field_2 = (anon_union_8_5_54ae9b2d_for_HlslToken_2)local_468.field_3;
      unaff_R13D = EHTokFloatConstant;
      break;
    case 0x9f:
      this->parserToken->field_2 = (anon_union_8_5_54ae9b2d_for_HlslToken_2)local_468.field_3;
      unaff_R13D = EHTokDoubleConstant;
      break;
    case 0xa0:
      this->parserToken->field_2 = (anon_union_8_5_54ae9b2d_for_HlslToken_2)local_468.field_3;
      unaff_R13D = EHTokFloat16Constant;
      break;
    case 0xa1:
      local_470 = this->tokenText;
      this_00 = GetThreadPoolAllocator();
      this_01 = (TString *)TPoolAllocator::allocate(this_00,0x28);
      local_478.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)this_01,
                 local_470,&local_478);
      (this->parserToken->field_2).string = this_01;
      unaff_R13D = EHTokStringConstant;
      break;
    case 0xa2:
      unaff_R13D = tokenizeIdentifier(this);
    }
    bVar2 = false;
LAB_0044e155:
    if (!bVar2) {
      return unaff_R13D;
    }
  } while( true );
}

Assistant:

EHlslTokenClass HlslScanContext::tokenizeClass(HlslToken& token)
{
    do {
        parserToken = &token;
        TPpToken ppToken;
        int token = ppContext.tokenize(ppToken);
        if (token == EndOfInput)
            return EHTokNone;

        tokenText = ppToken.name;
        loc = ppToken.loc;
        parserToken->loc = loc;
        switch (token) {
        case ';':                       return EHTokSemicolon;
        case ',':                       return EHTokComma;
        case ':':                       return EHTokColon;
        case '=':                       return EHTokAssign;
        case '(':                       return EHTokLeftParen;
        case ')':                       return EHTokRightParen;
        case '.':                       return EHTokDot;
        case '!':                       return EHTokBang;
        case '-':                       return EHTokDash;
        case '~':                       return EHTokTilde;
        case '+':                       return EHTokPlus;
        case '*':                       return EHTokStar;
        case '/':                       return EHTokSlash;
        case '%':                       return EHTokPercent;
        case '<':                       return EHTokLeftAngle;
        case '>':                       return EHTokRightAngle;
        case '|':                       return EHTokVerticalBar;
        case '^':                       return EHTokCaret;
        case '&':                       return EHTokAmpersand;
        case '?':                       return EHTokQuestion;
        case '[':                       return EHTokLeftBracket;
        case ']':                       return EHTokRightBracket;
        case '{':                       return EHTokLeftBrace;
        case '}':                       return EHTokRightBrace;
        case '\\':
            parseContext.error(loc, "illegal use of escape character", "\\", "");
            break;

        case PPAtomAddAssign:          return EHTokAddAssign;
        case PPAtomSubAssign:          return EHTokSubAssign;
        case PPAtomMulAssign:          return EHTokMulAssign;
        case PPAtomDivAssign:          return EHTokDivAssign;
        case PPAtomModAssign:          return EHTokModAssign;

        case PpAtomRight:              return EHTokRightOp;
        case PpAtomLeft:               return EHTokLeftOp;

        case PpAtomRightAssign:        return EHTokRightAssign;
        case PpAtomLeftAssign:         return EHTokLeftAssign;
        case PpAtomAndAssign:          return EHTokAndAssign;
        case PpAtomOrAssign:           return EHTokOrAssign;
        case PpAtomXorAssign:          return EHTokXorAssign;

        case PpAtomAnd:                return EHTokAndOp;
        case PpAtomOr:                 return EHTokOrOp;
        case PpAtomXor:                return EHTokXorOp;

        case PpAtomEQ:                 return EHTokEqOp;
        case PpAtomGE:                 return EHTokGeOp;
        case PpAtomNE:                 return EHTokNeOp;
        case PpAtomLE:                 return EHTokLeOp;

        case PpAtomDecrement:          return EHTokDecOp;
        case PpAtomIncrement:          return EHTokIncOp;

        case PpAtomColonColon:         return EHTokColonColon;

        case PpAtomConstInt:           parserToken->i = ppToken.ival;       return EHTokIntConstant;
        case PpAtomConstUint:          parserToken->i = ppToken.ival;       return EHTokUintConstant;
        case PpAtomConstFloat16:       parserToken->d = ppToken.dval;       return EHTokFloat16Constant;
        case PpAtomConstFloat:         parserToken->d = ppToken.dval;       return EHTokFloatConstant;
        case PpAtomConstDouble:        parserToken->d = ppToken.dval;       return EHTokDoubleConstant;
        case PpAtomIdentifier:
        {
            EHlslTokenClass token = tokenizeIdentifier();
            return token;
        }

        case PpAtomConstString: {
            parserToken->string = NewPoolTString(tokenText);
            return EHTokStringConstant;
        }

        case EndOfInput:               return EHTokNone;

        default:
            if (token < PpAtomMaxSingle) {
                char buf[2];
                buf[0] = (char)token;
                buf[1] = 0;
                parseContext.error(loc, "unexpected token", buf, "");
            } else if (tokenText[0] != 0)
                parseContext.error(loc, "unexpected token", tokenText, "");
            else
                parseContext.error(loc, "unexpected token", "", "");
            break;
        }
    } while (true);
}